

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<float> * __thiscall Fad<float>::operator/=(Fad<float> *this,float *val)

{
  uint uVar1;
  float *pfVar2;
  ulong uVar3;
  
  this->val_ = this->val_ / *val;
  uVar1 = (this->dx_).num_elts;
  if (((ulong)uVar1 != 0) && (0 < (int)uVar1)) {
    pfVar2 = (this->dx_).ptr_to_data;
    uVar3 = 0;
    do {
      pfVar2[uVar3] = pfVar2[uVar3] / *val;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator/= (const T& val)
{
  val_ /= val;

  int sz = dx_.size();
  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    for (int i=0; i<sz;++i)
      dxp[i] /= val;
  }

  return *this;
}